

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arg.h
# Opt level: O1

bool __thiscall TCLAP::Arg::argMatches(Arg *this,string *argFlag)

{
  size_t sVar1;
  bool bVar2;
  int iVar3;
  bool bVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  local_48.field_2._M_allocated_capacity._0_2_ = 0x2d;
  local_48._M_string_length = 1;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::operator+(&local_a8,&local_48,&this->_flag);
  sVar1 = argFlag->_M_string_length;
  if (sVar1 == local_a8._M_string_length) {
    if (sVar1 != 0) {
      iVar3 = bcmp((argFlag->_M_dataplus)._M_p,local_a8._M_dataplus._M_p,sVar1);
      if (iVar3 != 0) goto LAB_0010be72;
    }
    iVar3 = std::__cxx11::string::compare((char *)&this->_flag);
    if (iVar3 != 0) {
      bVar4 = true;
      bVar2 = false;
      goto LAB_0010bed4;
    }
  }
LAB_0010be72:
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  local_88.field_2._M_allocated_capacity._0_2_ = 0x2d2d;
  local_88._M_string_length = 2;
  local_88.field_2._M_local_buf[2] = '\0';
  std::operator+(&local_68,&local_88,&this->_name);
  sVar1 = argFlag->_M_string_length;
  if (sVar1 == local_68._M_string_length) {
    bVar2 = true;
    if (sVar1 == 0) {
      bVar4 = true;
    }
    else {
      iVar3 = bcmp((argFlag->_M_dataplus)._M_p,local_68._M_dataplus._M_p,sVar1);
      bVar4 = iVar3 == 0;
    }
  }
  else {
    bVar2 = true;
    bVar4 = false;
  }
LAB_0010bed4:
  if (bVar2) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return bVar4;
}

Assistant:

inline bool Arg::argMatches( const std::string& argFlag ) const
{
	if ( ( argFlag == Arg::flagStartString() + _flag && _flag != "" ) ||
	       argFlag == Arg::nameStartString() + _name )
		return true;
	else
		return false;
}